

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_string_in_fixed_set.c
# Opt level: O2

void NextPos(uchar **pos,char **key,char **multibyte_start)

{
  byte *pbVar1;
  
  *pos = *pos + 1;
  pbVar1 = (byte *)*key;
  if (*multibyte_start == (char *)0x0) {
    if (0xbf < *pbVar1) {
      *multibyte_start = (char *)pbVar1;
      return;
    }
    *key = (char *)(pbVar1 + 1);
  }
  else {
    *key = (char *)(pbVar1 + 1);
    if ((long)(pbVar1 + 1) - (long)*multibyte_start == (long)""[(byte)**multibyte_start >> 4]) {
      *multibyte_start = (char *)0x0;
      return;
    }
  }
  return;
}

Assistant:

static void NextPos(const unsigned char** pos,
	const char** key,
	const char** multibyte_start)
{
	++*pos;
	if (*multibyte_start) {
		/* Advance key to next byte in multibyte sequence. */
		++*key;
		/* Reset multibyte_start if last byte in multibyte sequence was consumed. */
		if (*key - *multibyte_start == GetMultibyteLength(**multibyte_start))
			*multibyte_start = 0;
	} else {
		if (GetMultibyteLength(**key)) {
			/* Multibyte prefix was matched in the dafsa, start matching multibyte
			 * content in next round. */
			*multibyte_start = *key;
		} else {
			/* Advance key as a single byte character was matched. */
			++*key;
		}
	}
}